

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer_holder.cc
# Opt level: O0

void callHello(ObjectHolder *oh)

{
  Object *pOVar1;
  ObjectHolder *oh_local;
  
  pOVar1 = PointerHolder<Object>::getPointer(oh);
  Object::hello(pOVar1);
  pOVar1 = PointerHolder<Object>::operator->(oh);
  Object::hello(pOVar1);
  pOVar1 = PointerHolder<Object>::operator*(oh);
  Object::hello(pOVar1);
  return;
}

Assistant:

void
callHello(ObjectHolder& oh)
{
    oh.getPointer()->hello();
    oh->hello();
    (*oh).hello();
}